

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O2

void __thiscall Movegen::initialize(Movegen *this,position *p)

{
  Color CVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  array<std::array<Square,_11UL>,_6UL> *paVar5;
  array<std::array<Square,_11UL>,_6UL> *paVar6;
  array<std::array<Square,_11UL>,_6UL> *paVar7;
  array<std::array<Square,_11UL>,_6UL> *paVar8;
  array<std::array<Square,_11UL>,_6UL> *paVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  piece_data *ppVar17;
  bool bVar18;
  
  CVar1 = (p->ifo).stm;
  uVar12 = (ulong)CVar1;
  this->us = CVar1;
  this->them = CVar1 ^ black;
  uVar10 = (p->pcs).bycolor._M_elems[1] | (p->pcs).bycolor._M_elems[0];
  this->all_pieces = uVar10;
  uVar10 = ~uVar10;
  this->empty = uVar10;
  uVar16 = 0xfffffff7;
  if (uVar12 == 0) {
    uVar16 = 0xfffffffd;
  }
  uVar14 = (uint)(p->ifo).cmask;
  this->can_castle_ks = ((uint)(uVar12 == 0) * 3 - 5 | uVar14) == 0xffffffff;
  this->can_castle_qs = (uVar16 | uVar14) == 0xffffffff;
  uVar11 = (p->ifo).checkers;
  this->check_target = uVar11;
  this->evasion_target = 0;
  if (uVar11 - 1 < (uVar11 ^ uVar11 - 1)) {
    lVar4 = 0;
    if (uVar11 != 0) {
      for (; (uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    if ((p->pcs).piece_on._M_elems[lVar4] - bishop < 3) {
      uVar15 = *(ulong *)(bitboards::between +
                         (ulong)(p->ifo).ks[uVar12] * 8 + (ulong)(uint)((int)lVar4 << 9)) & uVar10;
      this->evasion_target = uVar15;
      goto LAB_00118696;
    }
  }
  uVar15 = 0;
LAB_00118696:
  ppVar17 = &p->pcs;
  if (uVar12 == 0) {
    ppVar17 = (piece_data *)((p->pcs).bycolor._M_elems + 1);
  }
  paVar5 = (p->pcs).square_of._M_elems + 1;
  if (uVar12 == 0) {
    paVar5 = (p->pcs).square_of._M_elems;
  }
  paVar6 = (p->pcs).square_of._M_elems + 1;
  if (uVar12 == 0) {
    paVar6 = (p->pcs).square_of._M_elems;
  }
  paVar7 = (p->pcs).square_of._M_elems + 1;
  if (uVar12 == 0) {
    paVar7 = (p->pcs).square_of._M_elems;
  }
  paVar8 = (p->pcs).square_of._M_elems + 1;
  if (uVar12 == 0) {
    paVar8 = (p->pcs).square_of._M_elems;
  }
  bVar18 = uVar12 != 0;
  uVar13 = DAT_00140b68;
  uVar12 = DAT_00140b90;
  if (!bVar18) {
    uVar13 = DAT_00140b90;
    uVar12 = DAT_00140b68;
  }
  paVar9 = (p->pcs).square_of._M_elems + 1;
  if (!bVar18) {
    paVar9 = (p->pcs).square_of._M_elems;
  }
  this->rank2 = uVar12;
  this->rank7 = uVar13;
  uVar2 = (p->pcs).bitmap._M_elems[bVar18]._M_elems[0];
  this->pawns = uVar2;
  uVar3 = (ppVar17->bycolor)._M_elems[0];
  this->knights = (Square *)((long)(paVar9->_M_elems + 1) + 4);
  this->bishops = (Square *)((long)(paVar8->_M_elems + 2) + 4);
  this->rooks = (Square *)((long)(paVar7->_M_elems + 3) + 4);
  this->queens = (Square *)((long)(paVar6->_M_elems + 4) + 4);
  this->kings = (Square *)((long)(paVar5->_M_elems + 5) + 4);
  if (uVar15 != 0) {
    uVar10 = uVar15;
  }
  this->enemies = uVar3;
  if (uVar11 == 0) {
    uVar11 = uVar3;
  }
  this->qtarget = uVar10;
  this->ctarget = uVar11;
  this->eps = (p->ifo).eps;
  this->pawns2 = uVar12 & uVar2;
  this->pawns7 = uVar13 & uVar2;
  return;
}

Assistant:

inline Color to_move() const { return ifo.stm; }